

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockstep_scheduler_test.cpp
# Opt level: O0

void __thiscall
TestCase::TestCase(TestCase *this,uint timeout,uint unlocked_after,LockstepScheduler *ls)

{
  undefined8 in_RCX;
  int in_EDX;
  int in_ESI;
  atomic<int> *in_RDI;
  __integral_type_conflict in_stack_ffffffffffffffdc;
  
  (in_RDI->super___atomic_base<int>)._M_i = in_ESI + 0xbc614e;
  in_RDI[1].super___atomic_base<int>._M_i = in_EDX + 0xbc614e;
  *(undefined8 *)(in_RDI + 0x18) = in_RCX;
  std::atomic<bool>::atomic((atomic<bool> *)in_RDI,SUB41((uint)in_stack_ffffffffffffffdc >> 0x18,0))
  ;
  std::atomic<int>::atomic(in_RDI,in_stack_ffffffffffffffdc);
  std::shared_ptr<std::thread>::shared_ptr((shared_ptr<std::thread> *)0x1151de);
  pthread_mutex_init((pthread_mutex_t *)(in_RDI + 0xe),(pthread_mutexattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)(in_RDI + 2),(pthread_condattr_t *)0x0);
  return;
}

Assistant:

TestCase(unsigned timeout, unsigned unlocked_after, LockstepScheduler &ls) :
        timeout_(timeout + some_time_us),
        unlocked_after_(unlocked_after + some_time_us),
        ls_(ls)
    {
        pthread_mutex_init(&lock_, NULL);
        pthread_cond_init(&cond_, NULL);
    }